

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::handleFtpCommandOPTS(FtpSession *this,string *param)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  int iVar4;
  long lVar5;
  string param_upper;
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar2 = (param->_M_dataplus)._M_p;
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + param->_M_string_length);
  plVar3 = local_48;
  if (local_40 != 0) {
    lVar5 = 0;
    do {
      iVar4 = toupper((uint)*(byte *)((long)plVar3 + lVar5));
      *(char *)((long)plVar3 + lVar5) = (char)iVar4;
      lVar5 = lVar5 + 1;
    } while (local_40 != lVar5);
  }
  iVar4 = ::std::__cxx11::string::compare((char *)&local_48);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if (iVar4 == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OK","");
    sendFtpMessage(this,COMMAND_OK,&local_68);
  }
  else {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Unrecognized parameter","");
    sendFtpMessage(this,COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER,&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandOPTS(const std::string& param)
  {
    std::string param_upper = param;
    std::transform(param_upper.begin(), param_upper.end(), param_upper.begin(), [](char c) { return static_cast<char>(std::toupper(static_cast<unsigned char>(c))); });

    if (param_upper == "UTF8 ON")
    {
      sendFtpMessage(FtpReplyCode::COMMAND_OK, "OK");
      return;
    }

    sendFtpMessage(FtpReplyCode::COMMAND_NOT_IMPLEMENTED_FOR_PARAMETER, "Unrecognized parameter");
  }